

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

void __thiscall CInput::HandleJoystickButtonEvent(CInput *this,SDL_Event *Event)

{
  SDL_JoystickID SVar1;
  int Key_00;
  CJoystick *this_00;
  CInput *in_RSI;
  long *in_RDI;
  int Key;
  CJoystick *pJoystick;
  int in_stack_ffffffffffffffe0;
  
  this_00 = (CJoystick *)(**(code **)(*in_RDI + 0x38))();
  if (((this_00 != (CJoystick *)0x0) &&
      (SVar1 = CJoystick::GetInstanceID(this_00),
      SVar1 == *(int *)&(in_RSI->super_IEngineInput).super_IInput.super_IInterface.m_pKernel)) &&
     (*(byte *)((long)&(in_RSI->super_IEngineInput).super_IInput.super_IInterface.m_pKernel + 4) <
      0xc)) {
    Key_00 = *(byte *)((long)&(in_RSI->super_IEngineInput).super_IInput.super_IInterface.m_pKernel +
                      4) + 0x1a6;
    if (*(int *)&(in_RSI->super_IEngineInput).super_IInput.super_IInterface._vptr_IInterface ==
        0x603) {
      *(undefined1 *)((long)in_RDI + (long)Key_00 + 0x1aa0) = 1;
      *(short *)((long)in_RDI + (long)Key_00 * 2 + 0x16a0) = (short)(int)in_RDI[0x394];
      AddEvent(in_RSI,(char *)this_00,Key_00,in_stack_ffffffffffffffe0);
    }
    else if (*(int *)&(in_RSI->super_IEngineInput).super_IInput.super_IInterface._vptr_IInterface ==
             0x604) {
      *(undefined1 *)((long)in_RDI + (long)Key_00 + 0x1aa0) = 0;
      AddEvent(in_RSI,(char *)this_00,Key_00,in_stack_ffffffffffffffe0);
    }
  }
  return;
}

Assistant:

void CInput::HandleJoystickButtonEvent(const SDL_Event &Event)
{
	CJoystick *pJoystick = GetActiveJoystick();
	if(!pJoystick || pJoystick->GetInstanceID() != Event.jbutton.which)
		return;
	if(Event.jbutton.button >= NUM_JOYSTICK_BUTTONS)
		return;

	const int Key = Event.jbutton.button + KEY_JOYSTICK_BUTTON_0;

	if(Event.type == SDL_JOYBUTTONDOWN)
	{
		m_aInputState[Key] = true;
		m_aInputCount[Key] = m_InputCounter;
		AddEvent(0, Key, IInput::FLAG_PRESS);
	}
	else if(Event.type == SDL_JOYBUTTONUP)
	{
		m_aInputState[Key] = false;
		AddEvent(0, Key, IInput::FLAG_RELEASE);
	}
}